

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkUnsignedLongLongIntText_TestShell::
~TEST_TestHarness_c_checkUnsignedLongLongIntText_TestShell
          (TEST_TestHarness_c_checkUnsignedLongLongIntText_TestShell *this)

{
  TEST_TestHarness_c_checkUnsignedLongLongIntText_TestShell *this_local;
  
  ~TEST_TestHarness_c_checkUnsignedLongLongIntText_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestHarness_c, checkUnsignedLongLongIntText)
{
    CHECK_EQUAL_C_ULONGLONG_TEXT(2, 2, "Text");
    fixture->setTestFunction(failUnsignedLongLongIntTextMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    fixture->assertPrintContains("Message: UnsignedLongLongTestText");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}